

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O0

bool __thiscall
Js::DictionaryPropertyDescriptor<int>::SanityCheckFixedBits(DictionaryPropertyDescriptor<int> *this)

{
  bool bVar1;
  bool local_1b;
  bool local_1a;
  DictionaryPropertyDescriptor<int> *this_local;
  
  bVar1 = GetIsFixed(this);
  if ((!bVar1) && (bVar1 = GetUsedAsFixed(this), !bVar1)) {
    return true;
  }
  local_1a = false;
  if ((this->Attributes & 8) == 0) {
    local_1b = true;
    if ((this->Data == -1) && (local_1b = true, this->Getter == -1)) {
      local_1b = this->Setter != -1;
    }
    local_1a = local_1b;
  }
  return local_1a;
}

Assistant:

bool SanityCheckFixedBits()
        {
            return
                (!GetIsFixed() && !GetUsedAsFixed()) ||
                (!(this->Attributes & PropertyDeleted) && (this->Data != NoSlots || this->Getter != NoSlots || this->Setter != NoSlots));
        }